

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delim_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalDelimJoin::PhysicalDelimJoin
          (PhysicalDelimJoin *this,PhysicalOperatorType type,
          vector<duckdb::LogicalType,_true> *types,PhysicalOperator *original_join,
          PhysicalOperator *distinct,
          vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *delim_scans,
          idx_t estimated_cardinality,optional_idx delim_idx)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  PhysicalHashAggregate *pPVar4;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  
  pLVar1 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pLVar2 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_027bf6e0;
  (this->super_PhysicalOperator).type = type;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = pLVar2;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar3;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pLVar1;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).estimated_cardinality = estimated_cardinality;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalDelimJoin_027b93a8;
  this->join = original_join;
  pPVar4 = PhysicalOperator::Cast<duckdb::PhysicalHashAggregate>(distinct);
  this->distinct = pPVar4;
  ::std::
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::vector(&(this->delim_scans).
            super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           ,&delim_scans->
             super_vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
          );
  (this->delim_idx).index = delim_idx.index;
  return;
}

Assistant:

PhysicalDelimJoin::PhysicalDelimJoin(PhysicalOperatorType type, vector<LogicalType> types,
                                     PhysicalOperator &original_join, PhysicalOperator &distinct,
                                     const vector<const_reference<PhysicalOperator>> &delim_scans,
                                     idx_t estimated_cardinality, optional_idx delim_idx)
    : PhysicalOperator(type, std::move(types), estimated_cardinality), join(original_join),
      distinct(distinct.Cast<PhysicalHashAggregate>()), delim_scans(delim_scans), delim_idx(delim_idx) {
	D_ASSERT(type == PhysicalOperatorType::LEFT_DELIM_JOIN || type == PhysicalOperatorType::RIGHT_DELIM_JOIN);
}